

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

float __thiscall Assimp::CFIReaderImpl::getAttributeValueAsFloat(CFIReaderImpl *this,int idx)

{
  bool bVar1;
  size_type sVar2;
  element_type *peVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  element_type *peVar6;
  char *c;
  value_type local_58;
  undefined1 local_30 [8];
  shared_ptr<const_Assimp::FIFloatValue> floatValue;
  int idx_local;
  CFIReaderImpl *this_local;
  
  if ((-1 < idx) &&
     (floatValue.super___shared_ptr<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = idx,
     sVar2 = std::
             vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
             ::size(&this->attributes), idx < (int)sVar2)) {
    std::vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
    ::operator[](&this->attributes,
                 (long)floatValue.
                       super___shared_ptr<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._4_4_);
    std::dynamic_pointer_cast<Assimp::FIFloatValue_const,Assimp::FIValue_const>
              ((shared_ptr<const_Assimp::FIValue> *)local_30);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      sVar2 = std::vector<float,_std::allocator<float>_>::size(&peVar3->value);
      if (sVar2 == 1) {
        peVar3 = std::
                 __shared_ptr_access<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        pvVar4 = std::vector<float,_std::allocator<float>_>::front(&peVar3->value);
        local_58 = *pvVar4;
      }
      else {
        local_58 = 0.0;
      }
      this_local._4_4_ = local_58;
    }
    else {
      pvVar5 = std::
               vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
               ::operator[](&this->attributes,
                            (long)floatValue.
                                  super___shared_ptr<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi._4_4_);
      peVar6 = std::
               __shared_ptr_access<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pvVar5->value);
      (**peVar6->_vptr_FIValue)();
      c = (char *)std::__cxx11::string::c_str();
      this_local._4_4_ = fast_atof(c);
    }
    std::shared_ptr<const_Assimp::FIFloatValue>::~shared_ptr
              ((shared_ptr<const_Assimp::FIFloatValue> *)local_30);
    return this_local._4_4_;
  }
  return 0.0;
}

Assistant:

virtual float getAttributeValueAsFloat(int idx) const /*override*/ {
        if (idx < 0 || idx >= (int)attributes.size()) {
            return 0;
        }
        std::shared_ptr<const FIFloatValue> floatValue = std::dynamic_pointer_cast<const FIFloatValue>(attributes[idx].value);
        if (floatValue) {
            return floatValue->value.size() == 1 ? floatValue->value.front() : 0;
        }
        return fast_atof(attributes[idx].value->toString().c_str());
    }